

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmRenderSettings::ReadV5(ON_3dmRenderSettings *this,ON_BinaryArchive *file)

{
  bool bVar1;
  LengthUnitSystem LVar2;
  ON__INT32 local_28;
  uint local_24;
  int version;
  int i;
  int b;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_3dmRenderSettings *this_local;
  
  i._3_1_ = 0;
  local_28 = 0;
  _b = file;
  file_local = (ON_BinaryArchive *)this;
  bVar1 = ON_BinaryArchive::ReadInt(file,&local_28);
  if ((((bVar1) && (99 < local_28)) && (local_28 < 200)) &&
     (bVar1 = ON_BinaryArchive::ReadInt(_b,&version), bVar1)) {
    this->m_bCustomImageSize = version != 0;
    bVar1 = ON_BinaryArchive::ReadInt(_b,&this->m_image_width);
    if ((((bVar1) && (bVar1 = ON_BinaryArchive::ReadInt(_b,&this->m_image_height), bVar1)) &&
        ((bVar1 = ON_BinaryArchive::ReadColor(_b,&this->m_ambient_light), bVar1 &&
         ((bVar1 = ON_BinaryArchive::ReadInt(_b,&this->m_background_style), bVar1 &&
          (bVar1 = ON_BinaryArchive::ReadColor(_b,&this->m_background_color), bVar1)))))) &&
       ((bVar1 = ON_BinaryArchive::ReadString(_b,&this->m_background_bitmap_filename), bVar1 &&
        (bVar1 = ON_BinaryArchive::ReadInt(_b,&version), bVar1)))) {
      this->m_bUseHiddenLights = version != 0;
      bVar1 = ON_BinaryArchive::ReadInt(_b,&version);
      if (bVar1) {
        this->m_bDepthCue = version != 0;
        bVar1 = ON_BinaryArchive::ReadInt(_b,&version);
        if (bVar1) {
          this->m_bFlatShade = version != 0;
          bVar1 = ON_BinaryArchive::ReadInt(_b,&version);
          if (bVar1) {
            this->m_bRenderBackfaces = version != 0;
            bVar1 = ON_BinaryArchive::ReadInt(_b,&version);
            if (bVar1) {
              this->m_bRenderPoints = version != 0;
              bVar1 = ON_BinaryArchive::ReadInt(_b,&version);
              if (bVar1) {
                this->m_bRenderCurves = version != 0;
                bVar1 = ON_BinaryArchive::ReadInt(_b,&version);
                if (bVar1) {
                  this->m_bRenderIsoparams = version != 0;
                  bVar1 = ON_BinaryArchive::ReadInt(_b,&version);
                  if (bVar1) {
                    this->m_bRenderMeshEdges = version != 0;
                    bVar1 = ON_BinaryArchive::ReadInt(_b,&version);
                    if (bVar1) {
                      this->m_bRenderAnnotation = version != 0;
                      bVar1 = ON_BinaryArchive::ReadInt(_b,&this->m_antialias_style);
                      if ((((bVar1) &&
                           (bVar1 = ON_BinaryArchive::ReadInt(_b,&this->m_shadowmap_style), bVar1))
                          && (bVar1 = ON_BinaryArchive::ReadInt(_b,&this->m_shadowmap_width), bVar1)
                          ) && ((bVar1 = ON_BinaryArchive::ReadInt(_b,&this->m_shadowmap_height),
                                bVar1 && (bVar1 = ON_BinaryArchive::ReadDouble
                                                            (_b,&this->m_shadowmap_offset), bVar1)))
                         ) {
                        if (local_28 < 0x65) {
                          i._3_1_ = 1;
                        }
                        else {
                          bVar1 = ON_BinaryArchive::ReadDouble(_b,&this->m_image_dpi);
                          if ((bVar1) &&
                             (bVar1 = ON_BinaryArchive::ReadInt(_b,(ON__INT32 *)&local_24), bVar1))
                          {
                            LVar2 = ON::LengthUnitSystemFromUnsigned(local_24);
                            this->m_image_us = LVar2;
                            if (local_28 < 0x66) {
                              i._3_1_ = 1;
                            }
                            else {
                              bVar1 = ON_BinaryArchive::ReadColor
                                                (_b,&this->m_background_bottom_color);
                              if (bVar1) {
                                if (local_28 < 0x67) {
                                  i._3_1_ = 1;
                                }
                                else {
                                  bVar1 = ON_BinaryArchive::ReadBool
                                                    (_b,&this->m_bScaleBackgroundToFit);
                                  if (bVar1) {
                                    i._3_1_ = 1;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (bool)(i._3_1_ & 1);
}

Assistant:

bool ON_3dmRenderSettings::ReadV5( ON_BinaryArchive& file )
{
  bool rc;
  int b, i;
  int version;
  rc = false;
  for(;;)
  {
    version = 0;
    if ( !file.ReadInt( &version ) )
      break;
    if ( version < 100 )
      break;
    if ( version >= 200 )
      break;
    if ( !file.ReadInt( &b ) )
      break;
    m_bCustomImageSize = (0 != b);
    if ( !file.ReadInt( &m_image_width ) )
      break;
    if ( !file.ReadInt( &m_image_height ) )
      break;
    if ( !file.ReadColor( m_ambient_light ) )
      break;
    if ( !file.ReadInt( &m_background_style ) )
      break;
    if ( !file.ReadColor( m_background_color ) )
      break;
    if ( !file.ReadString( m_background_bitmap_filename ) )
      break;
    if ( !file.ReadInt( &b ) )
      break;
    m_bUseHiddenLights = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bDepthCue = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bFlatShade = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bRenderBackfaces = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bRenderPoints = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bRenderCurves = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bRenderIsoparams = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bRenderMeshEdges = (0 != b);
    if ( !file.ReadInt( &b ) )
      break;
    m_bRenderAnnotation = (0 != b);
    if ( !file.ReadInt( &m_antialias_style ) )
      break;
    if ( !file.ReadInt( &m_shadowmap_style ) )
      break;
    if ( !file.ReadInt( &m_shadowmap_width ) )
      break;
    if ( !file.ReadInt( &m_shadowmap_height ) )
      break;
    if ( !file.ReadDouble( &m_shadowmap_offset ) )
      break;
    
    if ( version < 101 )
    {
      rc = true;
      break;
    }
    if ( !file.ReadDouble( &m_image_dpi ) )
      break;
    if ( !file.ReadInt(&i) )
      break;
    m_image_us = ON::LengthUnitSystemFromUnsigned(i);
     
    
    if ( version < 102 )
    {
      rc = true;
      break;
    }
    if ( !file.ReadColor( m_background_bottom_color ) )
      break;

    if ( version < 103 )
    {
      rc = true;
      break;
    }
    if ( !file.ReadBool( &m_bScaleBackgroundToFit ) )
      break;

    rc = true;
    break;
  }

  return rc;
}